

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

uint getMinBucketToReserveForEntries(uint NumEntries)

{
  uint64_t uVar1;
  undefined4 local_c;
  uint NumEntries_local;
  
  if (NumEntries == 0) {
    local_c = 0;
  }
  else {
    uVar1 = llvm::NextPowerOf2((ulong)((NumEntries << 2) / 3 + 1));
    local_c = (uint)uVar1;
  }
  return local_c;
}

Assistant:

static unsigned getMinBucketToReserveForEntries(unsigned NumEntries) {
  // Ensure that "NumEntries * 4 < NumBuckets * 3"
  if (NumEntries == 0)
    return 0;
  // +1 is required because of the strict equality.
  // For example if NumEntries is 48, we need to return 401.
  return NextPowerOf2(NumEntries * 4 / 3 + 1);
}